

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kratos_expr.cc
# Opt level: O2

void setup_getitem<kratos::PortPackedStruct,kratos::Port>
               (class_<kratos::PortPackedStruct,_std::shared_ptr<kratos::PortPackedStruct>,_kratos::Port>
                *class_,bool add_str)

{
  class_<kratos::PortPackedStruct,std::shared_ptr<kratos::PortPackedStruct>,kratos::Port> *pcVar1;
  undefined7 in_register_00000031;
  type local_30;
  return_value_policy local_2f;
  type local_2e;
  return_value_policy local_2d;
  type local_2c;
  return_value_policy local_2b;
  type local_2a;
  return_value_policy local_29;
  
  local_2f = reference;
  pcVar1 = (class_<kratos::PortPackedStruct,std::shared_ptr<kratos::PortPackedStruct>,kratos::Port>
            *)pybind11::
              class_<kratos::PortPackedStruct,std::shared_ptr<kratos::PortPackedStruct>,kratos::Port>
              ::
              def<setup_getitem<kratos::PortPackedStruct,kratos::Port>(pybind11::class_<kratos::PortPackedStruct,std::shared_ptr<kratos::PortPackedStruct>,kratos::Port>&,bool)::_lambda(kratos::PortPackedStruct&,unsigned_int)_1_,pybind11::return_value_policy>
                        ((class_<kratos::PortPackedStruct,std::shared_ptr<kratos::PortPackedStruct>,kratos::Port>
                          *)class_,"__getitem__",&local_30,&local_2f);
  local_2d = reference;
  pcVar1 = (class_<kratos::PortPackedStruct,std::shared_ptr<kratos::PortPackedStruct>,kratos::Port>
            *)pybind11::
              class_<kratos::PortPackedStruct,std::shared_ptr<kratos::PortPackedStruct>,kratos::Port>
              ::
              def<setup_getitem<kratos::PortPackedStruct,kratos::Port>(pybind11::class_<kratos::PortPackedStruct,std::shared_ptr<kratos::PortPackedStruct>,kratos::Port>&,bool)::_lambda(kratos::PortPackedStruct&,std::pair<unsigned_int,unsigned_int>)_1_,pybind11::return_value_policy>
                        (pcVar1,"__getitem__",&local_2e,&local_2d);
  local_2b = reference;
  pybind11::class_<kratos::PortPackedStruct,std::shared_ptr<kratos::PortPackedStruct>,kratos::Port>
  ::
  def<setup_getitem<kratos::PortPackedStruct,kratos::Port>(pybind11::class_<kratos::PortPackedStruct,std::shared_ptr<kratos::PortPackedStruct>,kratos::Port>&,bool)::_lambda(kratos::PortPackedStruct&,std::shared_ptr<kratos::Var>const&)_1_,pybind11::return_value_policy>
            (pcVar1,"__getitem__",&local_2c,&local_2b);
  if ((int)CONCAT71(in_register_00000031,add_str) != 0) {
    local_29 = reference;
    pybind11::
    class_<kratos::PortPackedStruct,std::shared_ptr<kratos::PortPackedStruct>,kratos::Port>::
    def<setup_getitem<kratos::PortPackedStruct,kratos::Port>(pybind11::class_<kratos::PortPackedStruct,std::shared_ptr<kratos::PortPackedStruct>,kratos::Port>&,bool)::_lambda(kratos::PortPackedStruct&,std::__cxx11::string_const&)_1_,pybind11::return_value_policy>
              ((class_<kratos::PortPackedStruct,std::shared_ptr<kratos::PortPackedStruct>,kratos::Port>
                *)class_,"__getitem__",&local_2a,&local_29);
  }
  return;
}

Assistant:

void setup_getitem(py::class_<T, ::shared_ptr<T>, K> &class_, bool add_str = true) {
    using namespace kratos;
    class_
        .def(
            "__getitem__",
            [](T & var, uint32_t index) -> auto & { return var.Var::operator[](index); },
            py::return_value_policy::reference)
        .def(
            "__getitem__", [](T & var, std::pair<uint32_t, uint32_t> slice) -> auto & {
                return var.Var::operator[](slice);
            },
            py::return_value_policy::reference)
        .def(
            "__getitem__", [](T & var, const std::shared_ptr<kratos::Var> &slice) -> auto & {
                return var.Var::operator[](slice);
            },
            py::return_value_policy::reference);

    if (add_str) {
        class_.def(
            "__getitem__", [](T & var, const std::string &name) -> auto & { return var[name]; },
            py::return_value_policy::reference);
    }
}